

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O1

Data * __thiscall
density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
consume_operation::
element<density_tests::detail::PutRawBlocks<density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>>::Data>
          (consume_operation *this)

{
  runtime_type<> *prVar1;
  Data *pDVar2;
  
  if (*(long *)(this + 8) != 0) {
    prVar1 = heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
             consume_operation::complete_type((consume_operation *)this);
    if (prVar1->m_feature_table ==
        (tuple_type *)
        detail::
        FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,density_tests::detail::PutRawBlocks<density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>>::Data>
        ::s_table) goto LAB_00c56195;
  }
  density_tests::detail::assert_failed<>
            ("!empty() && complete_type().template is<COMPLETE_ELEMENT_TYPE>()",
             "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/heter_queue.h"
             ,0x415);
LAB_00c56195:
  pDVar2 = (Data *)heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   ::get_element(*(QueueControl **)(this + 8));
  return pDVar2;
}

Assistant:

COMPLETE_ELEMENT_TYPE & element() const noexcept
            {
                DENSITY_ASSERT(!empty() && complete_type().template is<COMPLETE_ELEMENT_TYPE>());
                return *static_cast<COMPLETE_ELEMENT_TYPE *>(get_element(m_control));
            }